

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# customwidgetsinfo.cpp
# Opt level: O3

bool __thiscall
CustomWidgetsInfo::extends
          (CustomWidgetsInfo *this,QString *classNameIn,QAnyStringView baseClassName)

{
  QMapData<std::map<QString,_DomCustomWidget_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_DomCustomWidget_*>_>_>_>
  *pQVar1;
  _Base_ptr p_Var2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  bool bVar4;
  char cVar5;
  const_iterator cVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QAnyStringView QVar9;
  QStringView QVar10;
  QAnyStringView QVar11;
  QString local_68;
  key_type local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar9.m_size = (classNameIn->d).size | 0x8000000000000000;
  QVar9.field_0.m_data_utf16 = (classNameIn->d).ptr;
  cVar5 = QAnyStringView::equal(QVar9,baseClassName);
  bVar7 = true;
  if (cVar5 == '\0') {
    local_50.d.d = (classNameIn->d).d;
    local_50.d.ptr = (classNameIn->d).ptr;
    local_50.d.size = (classNameIn->d).size;
    bVar7 = true;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_50.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    do {
      pQVar1 = (this->m_customWidgets).d.d.ptr;
      if (((pQVar1 == (QMapData<std::map<QString,_DomCustomWidget_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_DomCustomWidget_*>_>_>_>
                       *)0x0) ||
          (cVar6 = std::
                   _Rb_tree<QString,_std::pair<const_QString,_DomCustomWidget_*>,_std::_Select1st<std::pair<const_QString,_DomCustomWidget_*>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_DomCustomWidget_*>_>_>
                   ::find(&(pQVar1->m)._M_t,&local_50),
          (_Rb_tree_header *)cVar6._M_node ==
          &(((this->m_customWidgets).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header)) ||
         (p_Var2 = cVar6._M_node[1]._M_right, p_Var2 == (_Base_ptr)0x0)) {
        bVar7 = false;
        break;
      }
      local_68.d.d = *(Data **)(p_Var2 + 1);
      aVar3 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)p_Var2[1]._M_parent;
      p_Var2 = p_Var2[1]._M_left;
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_68.d.ptr = (char16_t *)aVar3;
      local_68.d.size = (qsizetype)p_Var2;
      if (((_Base_ptr)local_50.d.size == p_Var2) &&
         (QVar8.m_data = (storage_type_conflict *)aVar3.m_data, QVar8.m_size = (qsizetype)p_Var2,
         QVar10.m_data = local_50.d.ptr, QVar10.m_size = (qsizetype)p_Var2,
         cVar5 = QtPrivate::equalStrings(QVar10,QVar8), cVar5 != '\0')) {
        bVar7 = false;
LAB_0013cfce:
        bVar4 = false;
      }
      else {
        QVar11.m_size = (ulong)p_Var2 | 0x8000000000000000;
        QVar11.field_0.m_data = aVar3.m_data;
        cVar5 = QAnyStringView::equal(QVar11,baseClassName);
        if (cVar5 != '\0') {
          bVar7 = true;
          goto LAB_0013cfce;
        }
        QString::operator=(&local_50,&local_68);
        bVar4 = true;
      }
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
    } while (bVar4);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool CustomWidgetsInfo::extends(const QString &classNameIn, QAnyStringView baseClassName) const
{
    if (classNameIn == baseClassName)
        return true;

    QString className = classNameIn;
    while (const DomCustomWidget *c = customWidget(className)) {
        const QString extends = c->elementExtends();
        if (className == extends) // Faulty legacy custom widget entries exist.
            return false;
        if (extends == baseClassName)
            return true;
        className = extends;
    }
    return false;
}